

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

void CVmObjLookupTable::get_constructor_args
               (uint argc,size_t *bucket_count,size_t *init_capacity,vm_val_t *src_obj)

{
  int iVar1;
  int32_t iVar2;
  vm_val_t *in_RCX;
  long lVar3;
  vm_val_t *in_RDX;
  vm_val_t *in_RSI;
  int in_EDI;
  int cnt;
  
  vm_val_t::set_nil(in_RCX);
  if (in_EDI == 0) {
    *(long *)in_RSI = 0x20;
    *(long *)in_RDX = 0x40;
  }
  else if (in_EDI == 1) {
    CVmStack::pop(in_RCX);
    iVar1 = vm_val_t::is_listlike(in_RSI);
    if ((iVar1 == 0) || (iVar1 = vm_val_t::ll_length(in_RDX), iVar1 < 0)) {
      err_throw(0);
    }
    lVar3 = (long)((iVar1 * 3) / 2);
    *(long *)in_RDX = lVar3;
    *(long *)in_RSI = lVar3;
  }
  else {
    if (in_EDI != 2) {
      err_throw(0);
    }
    iVar2 = CVmBif::pop_long_val();
    *(long *)in_RSI = (long)iVar2;
    iVar2 = CVmBif::pop_long_val();
    *(long *)in_RDX = (long)iVar2;
  }
  CVmStack::push(in_RCX);
  if ((*(long *)in_RSI != 0) && (*(long *)in_RDX != 0)) {
    return;
  }
  err_throw(0);
}

Assistant:

void CVmObjLookupTable::get_constructor_args(VMG_ uint argc,
                                             size_t *bucket_count,
                                             size_t *init_capacity,
                                             vm_val_t *src_obj)
{
    /* presume no source object */
    src_obj->set_nil();

    /* check arguments */
    if (argc == 0)
    {
        /* no arguments - they want default parameters */
        *bucket_count = 32;
        *init_capacity = 64;
    }
    else if (argc == 1)
    {
        int cnt;
        
        /* 
         *   One argument - they want to create from a list.  Retrieve the
         *   list or vector object. 
         */
        G_stk->pop(src_obj);

        /* make sure it's a list or vector */
        if (!src_obj->is_listlike(vmg0_)
            || (cnt = src_obj->ll_length(vmg0_)) < 0)
            err_throw(VMERR_BAD_VAL_BIF);

        /* use 1.5x the pair count as the bucket count and capacity */
        *bucket_count = *init_capacity = cnt*3 / 2;
    }
    else if (argc == 2)
    {
        /* 
         *   two arguments - they specified the bucket count and initial
         *   capacity; pop the parameters 
         */
        *bucket_count = (size_t)CVmBif::pop_long_val(vmg0_);
        *init_capacity = (size_t)CVmBif::pop_long_val(vmg0_);
    }
    else
    {
        /* invalid arguments */
        err_throw(VMERR_WRONG_NUM_OF_ARGS);
    }

    /* re-push the source object to protect it from gc */
    G_stk->push(src_obj);

    /* make sure both are positive */
    if (*bucket_count <= 0 || *init_capacity <= 0)
        err_throw(VMERR_BAD_VAL_BIF);
}